

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

void __thiscall wallet::CWallet::BlockUntilSyncedToCurrentChain(CWallet *this)

{
  Chain *pCVar1;
  long in_FS_OFFSET;
  uint256 last_block_hash;
  unique_lock<std::recursive_mutex> local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._M_device = &(this->cs_wallet).super_recursive_mutex;
  local_48._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_48);
  local_38 = *(undefined8 *)(this->m_last_block_processed).super_base_blob<256U>.m_data._M_elems;
  uStack_30 = *(undefined8 *)
               ((this->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 8);
  local_28 = *(undefined8 *)
              ((this->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 0x10);
  uStack_20 = *(undefined8 *)
               ((this->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 0x18);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_48);
  pCVar1 = this->m_chain;
  if (pCVar1 == (Chain *)0x0) {
    __assert_fail("m_chain",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.h"
                  ,0x1f5,"interfaces::Chain &wallet::CWallet::chain() const");
  }
  (*pCVar1->_vptr_Chain[0x2a])(pCVar1,&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CWallet::BlockUntilSyncedToCurrentChain() const {
    AssertLockNotHeld(cs_wallet);
    // Skip the queue-draining stuff if we know we're caught up with
    // chain().Tip(), otherwise put a callback in the validation interface queue and wait
    // for the queue to drain enough to execute it (indicating we are caught up
    // at least with the time we entered this function).
    uint256 last_block_hash = WITH_LOCK(cs_wallet, return m_last_block_processed);
    chain().waitForNotificationsIfTipChanged(last_block_hash);
}